

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  ulong unaff_R12;
  size_t mask;
  ulong uVar49;
  long lVar50;
  int iVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar65;
  float fVar66;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  float fVar80;
  undefined1 auVar79 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  uint uVar89;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  undefined1 auVar90 [64];
  undefined1 auVar94 [64];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 local_14c8 [16];
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  ulong local_1470;
  undefined1 local_1468 [16];
  Scene *local_1458;
  undefined8 uStack_1450;
  ulong local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  NodeRef *local_1418;
  RayQueryContext *local_1410;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  auVar42 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar56 = ray->tfar;
    if (0.0 <= fVar56) {
      local_1418 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar78 = vandps_avx((undefined1  [16])aVar2,auVar78);
      auVar81._8_4_ = 0x219392ef;
      auVar81._0_8_ = 0x219392ef219392ef;
      auVar81._12_4_ = 0x219392ef;
      auVar78 = vcmpps_avx(auVar78,auVar81,1);
      auVar78 = vblendvps_avx((undefined1  [16])aVar2,auVar81,auVar78);
      auVar81 = vrcpps_avx(auVar78);
      fVar65 = auVar81._0_4_;
      auVar73._0_4_ = fVar65 * auVar78._0_4_;
      fVar66 = auVar81._4_4_;
      auVar73._4_4_ = fVar66 * auVar78._4_4_;
      fVar67 = auVar81._8_4_;
      auVar73._8_4_ = fVar67 * auVar78._8_4_;
      fVar80 = auVar81._12_4_;
      auVar73._12_4_ = fVar80 * auVar78._12_4_;
      auVar82._8_4_ = 0x3f800000;
      auVar82._0_8_ = &DAT_3f8000003f800000;
      auVar82._12_4_ = 0x3f800000;
      auVar78 = vsubps_avx(auVar82,auVar73);
      uVar48 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar48;
      local_11f8._0_4_ = uVar48;
      local_11f8._8_4_ = uVar48;
      local_11f8._12_4_ = uVar48;
      local_11f8._16_4_ = uVar48;
      local_11f8._20_4_ = uVar48;
      local_11f8._24_4_ = uVar48;
      local_11f8._28_4_ = uVar48;
      auVar84 = ZEXT3264(local_11f8);
      uVar48 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar48;
      local_1218._0_4_ = uVar48;
      local_1218._8_4_ = uVar48;
      local_1218._12_4_ = uVar48;
      local_1218._16_4_ = uVar48;
      local_1218._20_4_ = uVar48;
      local_1218._24_4_ = uVar48;
      local_1218._28_4_ = uVar48;
      auVar86 = ZEXT3264(local_1218);
      auVar74._0_4_ = fVar65 + fVar65 * auVar78._0_4_;
      auVar74._4_4_ = fVar66 + fVar66 * auVar78._4_4_;
      auVar74._8_4_ = fVar67 + fVar67 * auVar78._8_4_;
      auVar74._12_4_ = fVar80 + fVar80 * auVar78._12_4_;
      uVar48 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar48;
      local_1238._0_4_ = uVar48;
      local_1238._8_4_ = uVar48;
      local_1238._12_4_ = uVar48;
      local_1238._16_4_ = uVar48;
      local_1238._20_4_ = uVar48;
      local_1238._24_4_ = uVar48;
      local_1238._28_4_ = uVar48;
      auVar88 = ZEXT3264(local_1238);
      auVar78 = vshufps_avx(auVar74,auVar74,0);
      local_1258._16_16_ = auVar78;
      local_1258._0_16_ = auVar78;
      auVar90 = ZEXT3264(local_1258);
      auVar78 = vmovshdup_avx(auVar74);
      auVar81 = vshufps_avx(auVar74,auVar74,0x55);
      local_1278._16_16_ = auVar81;
      local_1278._0_16_ = auVar81;
      auVar94 = ZEXT3264(local_1278);
      auVar81 = vshufpd_avx(auVar74,auVar74,1);
      auVar73 = vshufps_avx(auVar74,auVar74,0xaa);
      local_1420 = (ulong)(auVar74._0_4_ < 0.0) << 5;
      local_1428 = (ulong)(auVar78._0_4_ < 0.0) << 5 | 0x40;
      local_1298._16_16_ = auVar73;
      local_1298._0_16_ = auVar73;
      auVar77 = ZEXT3264(local_1298);
      local_1430 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x80;
      local_1438 = local_1420 ^ 0x20;
      uVar44 = local_1428 ^ 0x20;
      uVar49 = local_1430 ^ 0x20;
      auVar78 = vshufps_avx(auVar53,auVar53,0);
      local_12b8._16_16_ = auVar78;
      local_12b8._0_16_ = auVar78;
      auVar79 = ZEXT3264(local_12b8);
      auVar78 = vshufps_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56),0);
      local_12d8._16_16_ = auVar78;
      local_12d8._0_16_ = auVar78;
      auVar83 = ZEXT3264(local_12d8);
      local_1410 = context;
      local_1470 = uVar49;
      do {
        if (local_1418 == stack) {
          return;
        }
        uVar46 = local_1418[-1].ptr;
        local_1418 = local_1418 + -1;
        do {
          if ((uVar46 & 8) == 0) {
            auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + local_1420),auVar84._0_32_);
            auVar15._4_4_ = auVar90._4_4_ * auVar14._4_4_;
            auVar15._0_4_ = auVar90._0_4_ * auVar14._0_4_;
            auVar15._8_4_ = auVar90._8_4_ * auVar14._8_4_;
            auVar15._12_4_ = auVar90._12_4_ * auVar14._12_4_;
            auVar15._16_4_ = auVar90._16_4_ * auVar14._16_4_;
            auVar15._20_4_ = auVar90._20_4_ * auVar14._20_4_;
            auVar15._24_4_ = auVar90._24_4_ * auVar14._24_4_;
            auVar15._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + local_1428),auVar86._0_32_);
            auVar16._4_4_ = auVar94._4_4_ * auVar14._4_4_;
            auVar16._0_4_ = auVar94._0_4_ * auVar14._0_4_;
            auVar16._8_4_ = auVar94._8_4_ * auVar14._8_4_;
            auVar16._12_4_ = auVar94._12_4_ * auVar14._12_4_;
            auVar16._16_4_ = auVar94._16_4_ * auVar14._16_4_;
            auVar16._20_4_ = auVar94._20_4_ * auVar14._20_4_;
            auVar16._24_4_ = auVar94._24_4_ * auVar14._24_4_;
            auVar16._28_4_ = auVar14._28_4_;
            auVar14 = vmaxps_avx(auVar15,auVar16);
            auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + local_1430),auVar88._0_32_);
            auVar17._4_4_ = auVar77._4_4_ * auVar15._4_4_;
            auVar17._0_4_ = auVar77._0_4_ * auVar15._0_4_;
            auVar17._8_4_ = auVar77._8_4_ * auVar15._8_4_;
            auVar17._12_4_ = auVar77._12_4_ * auVar15._12_4_;
            auVar17._16_4_ = auVar77._16_4_ * auVar15._16_4_;
            auVar17._20_4_ = auVar77._20_4_ * auVar15._20_4_;
            auVar17._24_4_ = auVar77._24_4_ * auVar15._24_4_;
            auVar17._28_4_ = auVar15._28_4_;
            auVar15 = vmaxps_avx(auVar17,auVar79._0_32_);
            auVar14 = vmaxps_avx(auVar14,auVar15);
            auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + local_1438),auVar84._0_32_);
            auVar18._4_4_ = auVar90._4_4_ * auVar15._4_4_;
            auVar18._0_4_ = auVar90._0_4_ * auVar15._0_4_;
            auVar18._8_4_ = auVar90._8_4_ * auVar15._8_4_;
            auVar18._12_4_ = auVar90._12_4_ * auVar15._12_4_;
            auVar18._16_4_ = auVar90._16_4_ * auVar15._16_4_;
            auVar18._20_4_ = auVar90._20_4_ * auVar15._20_4_;
            auVar18._24_4_ = auVar90._24_4_ * auVar15._24_4_;
            auVar18._28_4_ = auVar15._28_4_;
            auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar44),auVar86._0_32_);
            auVar19._4_4_ = auVar94._4_4_ * auVar15._4_4_;
            auVar19._0_4_ = auVar94._0_4_ * auVar15._0_4_;
            auVar19._8_4_ = auVar94._8_4_ * auVar15._8_4_;
            auVar19._12_4_ = auVar94._12_4_ * auVar15._12_4_;
            auVar19._16_4_ = auVar94._16_4_ * auVar15._16_4_;
            auVar19._20_4_ = auVar94._20_4_ * auVar15._20_4_;
            auVar19._24_4_ = auVar94._24_4_ * auVar15._24_4_;
            auVar19._28_4_ = auVar15._28_4_;
            auVar15 = vminps_avx(auVar18,auVar19);
            auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar49),auVar88._0_32_);
            auVar20._4_4_ = auVar77._4_4_ * auVar16._4_4_;
            auVar20._0_4_ = auVar77._0_4_ * auVar16._0_4_;
            auVar20._8_4_ = auVar77._8_4_ * auVar16._8_4_;
            auVar20._12_4_ = auVar77._12_4_ * auVar16._12_4_;
            auVar20._16_4_ = auVar77._16_4_ * auVar16._16_4_;
            auVar20._20_4_ = auVar77._20_4_ * auVar16._20_4_;
            auVar20._24_4_ = auVar77._24_4_ * auVar16._24_4_;
            auVar20._28_4_ = auVar16._28_4_;
            auVar16 = vminps_avx(auVar20,auVar83._0_32_);
            auVar15 = vminps_avx(auVar15,auVar16);
            auVar14 = vcmpps_avx(auVar14,auVar15,2);
            uVar48 = vmovmskps_avx(auVar14);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar48);
          }
          if ((uVar46 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar51 = 4;
            }
            else {
              uVar45 = uVar46 & 0xfffffffffffffff0;
              lVar50 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              iVar51 = 0;
              uVar46 = *(ulong *)(uVar45 + lVar50 * 8);
              uVar47 = unaff_R12 - 1 & unaff_R12;
              if (uVar47 != 0) {
                local_1418->ptr = uVar46;
                lVar50 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                  }
                }
                uVar43 = uVar47 - 1;
                while( true ) {
                  local_1418 = local_1418 + 1;
                  uVar46 = *(ulong *)(uVar45 + lVar50 * 8);
                  uVar43 = uVar43 & uVar47;
                  if (uVar43 == 0) break;
                  local_1418->ptr = uVar46;
                  lVar50 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                    }
                  }
                  uVar47 = uVar43 - 1;
                }
                iVar51 = 0;
              }
            }
          }
          else {
            iVar51 = 6;
          }
        } while (iVar51 == 0);
        if (iVar51 == 6) {
          local_1440 = (ulong)((uint)uVar46 & 0xf) - 8;
          bVar52 = local_1440 != 0;
          if (bVar52) {
            uVar46 = uVar46 & 0xfffffffffffffff0;
            uVar49 = 0;
            do {
              lVar50 = uVar49 * 0xb0;
              pfVar1 = (float *)(uVar46 + 0x80 + lVar50);
              fVar21 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar23 = pfVar1[2];
              fVar24 = pfVar1[3];
              pfVar1 = (float *)(uVar46 + 0x40 + lVar50);
              fVar25 = *pfVar1;
              fVar26 = pfVar1[1];
              fVar27 = pfVar1[2];
              fVar28 = pfVar1[3];
              auVar53._0_4_ = fVar21 * fVar25;
              auVar53._4_4_ = fVar22 * fVar26;
              auVar53._8_4_ = fVar23 * fVar27;
              auVar53._12_4_ = fVar24 * fVar28;
              pfVar1 = (float *)(uVar46 + 0x70 + lVar50);
              fVar29 = *pfVar1;
              fVar30 = pfVar1[1];
              fVar31 = pfVar1[2];
              fVar32 = pfVar1[3];
              pfVar1 = (float *)(uVar46 + 0x50 + lVar50);
              fVar33 = *pfVar1;
              fVar34 = pfVar1[1];
              fVar35 = pfVar1[2];
              fVar36 = pfVar1[3];
              auVar57._0_4_ = fVar29 * fVar33;
              auVar57._4_4_ = fVar30 * fVar34;
              auVar57._8_4_ = fVar31 * fVar35;
              auVar57._12_4_ = fVar32 * fVar36;
              local_14c8 = vsubps_avx(auVar57,auVar53);
              auVar78 = *(undefined1 (*) [16])(uVar46 + 0x60 + lVar50);
              fVar95 = auVar78._0_4_;
              auVar58._0_4_ = fVar95 * fVar33;
              fVar96 = auVar78._4_4_;
              auVar58._4_4_ = fVar96 * fVar34;
              fVar97 = auVar78._8_4_;
              auVar58._8_4_ = fVar97 * fVar35;
              fVar98 = auVar78._12_4_;
              auVar58._12_4_ = fVar98 * fVar36;
              pfVar1 = (float *)(uVar46 + 0x30 + lVar50);
              fVar37 = *pfVar1;
              fVar38 = pfVar1[1];
              fVar39 = pfVar1[2];
              fVar40 = pfVar1[3];
              auVar68._0_4_ = fVar21 * fVar37;
              auVar68._4_4_ = fVar22 * fVar38;
              auVar68._8_4_ = fVar23 * fVar39;
              auVar68._12_4_ = fVar24 * fVar40;
              local_1498 = vsubps_avx(auVar68,auVar58);
              auVar69._0_4_ = fVar29 * fVar37;
              auVar69._4_4_ = fVar30 * fVar38;
              auVar69._8_4_ = fVar31 * fVar39;
              auVar69._12_4_ = fVar32 * fVar40;
              auVar99._0_4_ = fVar95 * fVar25;
              auVar99._4_4_ = fVar96 * fVar26;
              auVar99._8_4_ = fVar97 * fVar27;
              auVar99._12_4_ = fVar98 * fVar28;
              local_14a8 = vsubps_avx(auVar99,auVar69);
              uVar48 = *(undefined4 *)&(ray->org).field_0;
              auVar100._4_4_ = uVar48;
              auVar100._0_4_ = uVar48;
              auVar100._8_4_ = uVar48;
              auVar100._12_4_ = uVar48;
              auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + lVar50),auVar100);
              uVar48 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar101._4_4_ = uVar48;
              auVar101._0_4_ = uVar48;
              auVar101._8_4_ = uVar48;
              auVar101._12_4_ = uVar48;
              local_1488 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x10 + lVar50),auVar101);
              uVar48 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar102._4_4_ = uVar48;
              auVar102._0_4_ = uVar48;
              auVar102._8_4_ = uVar48;
              auVar102._12_4_ = uVar48;
              local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar46 + 0x20 + lVar50),auVar102);
              fVar56 = (ray->dir).field_0.m128[1];
              fVar65 = (ray->dir).field_0.m128[2];
              fVar67 = local_1468._0_4_;
              auVar103._0_4_ = fVar56 * fVar67;
              fVar5 = local_1468._4_4_;
              auVar103._4_4_ = fVar56 * fVar5;
              fVar8 = local_1468._8_4_;
              auVar103._8_4_ = fVar56 * fVar8;
              fVar11 = local_1468._12_4_;
              auVar103._12_4_ = fVar56 * fVar11;
              fVar80 = local_1488._0_4_;
              auVar104._0_4_ = fVar65 * fVar80;
              fVar6 = local_1488._4_4_;
              auVar104._4_4_ = fVar65 * fVar6;
              fVar9 = local_1488._8_4_;
              auVar104._8_4_ = fVar65 * fVar9;
              fVar12 = local_1488._12_4_;
              auVar104._12_4_ = fVar65 * fVar12;
              auVar53 = vsubps_avx(auVar104,auVar103);
              fVar66 = (ray->dir).field_0.m128[0];
              fVar4 = auVar73._0_4_;
              auVar54._0_4_ = fVar65 * fVar4;
              fVar7 = auVar73._4_4_;
              auVar54._4_4_ = fVar65 * fVar7;
              fVar10 = auVar73._8_4_;
              auVar54._8_4_ = fVar65 * fVar10;
              fVar13 = auVar73._12_4_;
              auVar54._12_4_ = fVar65 * fVar13;
              auVar59._0_4_ = fVar66 * fVar67;
              auVar59._4_4_ = fVar66 * fVar5;
              auVar59._8_4_ = fVar66 * fVar8;
              auVar59._12_4_ = fVar66 * fVar11;
              auVar81 = vsubps_avx(auVar59,auVar54);
              auVar60._0_4_ = fVar66 * fVar80;
              auVar60._4_4_ = fVar66 * fVar6;
              auVar60._8_4_ = fVar66 * fVar9;
              auVar60._12_4_ = fVar66 * fVar12;
              auVar70._0_4_ = fVar56 * fVar4;
              auVar70._4_4_ = fVar56 * fVar7;
              auVar70._8_4_ = fVar56 * fVar10;
              auVar70._12_4_ = fVar56 * fVar13;
              auVar74 = vsubps_avx(auVar70,auVar60);
              auVar71._0_4_ =
                   local_14c8._0_4_ * fVar66 + fVar56 * local_1498._0_4_ + fVar65 * local_14a8._0_4_
              ;
              auVar71._4_4_ =
                   local_14c8._4_4_ * fVar66 + fVar56 * local_1498._4_4_ + fVar65 * local_14a8._4_4_
              ;
              auVar71._8_4_ =
                   local_14c8._8_4_ * fVar66 + fVar56 * local_1498._8_4_ + fVar65 * local_14a8._8_4_
              ;
              auVar71._12_4_ =
                   local_14c8._12_4_ * fVar66 +
                   fVar56 * local_1498._12_4_ + fVar65 * local_14a8._12_4_;
              auVar61._8_8_ = 0x8000000080000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar78 = vandps_avx(auVar71,auVar61);
              uVar89 = auVar78._0_4_;
              auVar85._0_4_ =
                   (float)(uVar89 ^ (uint)(fVar95 * auVar53._0_4_ +
                                          fVar21 * auVar74._0_4_ + fVar29 * auVar81._0_4_));
              uVar91 = auVar78._4_4_;
              auVar85._4_4_ =
                   (float)(uVar91 ^ (uint)(fVar96 * auVar53._4_4_ +
                                          fVar22 * auVar74._4_4_ + fVar30 * auVar81._4_4_));
              uVar92 = auVar78._8_4_;
              auVar85._8_4_ =
                   (float)(uVar92 ^ (uint)(fVar97 * auVar53._8_4_ +
                                          fVar23 * auVar74._8_4_ + fVar31 * auVar81._8_4_));
              uVar93 = auVar78._12_4_;
              auVar85._12_4_ =
                   (float)(uVar93 ^ (uint)(fVar98 * auVar53._12_4_ +
                                          fVar24 * auVar74._12_4_ + fVar32 * auVar81._12_4_));
              auVar87._0_4_ =
                   (float)(uVar89 ^ (uint)(fVar37 * auVar53._0_4_ +
                                          fVar33 * auVar74._0_4_ + fVar25 * auVar81._0_4_));
              auVar87._4_4_ =
                   (float)(uVar91 ^ (uint)(fVar38 * auVar53._4_4_ +
                                          fVar34 * auVar74._4_4_ + fVar26 * auVar81._4_4_));
              auVar87._8_4_ =
                   (float)(uVar92 ^ (uint)(fVar39 * auVar53._8_4_ +
                                          fVar35 * auVar74._8_4_ + fVar27 * auVar81._8_4_));
              auVar87._12_4_ =
                   (float)(uVar93 ^ (uint)(fVar40 * auVar53._12_4_ +
                                          fVar36 * auVar74._12_4_ + fVar28 * auVar81._12_4_));
              auVar81 = ZEXT416(0) << 0x20;
              auVar78 = vcmpps_avx(auVar85,auVar81,5);
              auVar53 = vcmpps_avx(auVar87,auVar81,5);
              auVar78 = vandps_avx(auVar78,auVar53);
              auVar62._8_4_ = 0x7fffffff;
              auVar62._0_8_ = 0x7fffffff7fffffff;
              auVar62._12_4_ = 0x7fffffff;
              auVar53 = vandps_avx(auVar71,auVar62);
              auVar81 = vcmpps_avx(auVar81,auVar71,4);
              auVar78 = vandps_avx(auVar78,auVar81);
              auVar63._0_4_ = auVar87._0_4_ + auVar85._0_4_;
              auVar63._4_4_ = auVar87._4_4_ + auVar85._4_4_;
              auVar63._8_4_ = auVar87._8_4_ + auVar85._8_4_;
              auVar63._12_4_ = auVar87._12_4_ + auVar85._12_4_;
              auVar81 = vcmpps_avx(auVar63,auVar53,2);
              auVar78 = vandps_avx(auVar78,auVar81);
              auVar81 = auVar42 & auVar78;
              if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar81[0xf] < '\0') {
                auVar78 = vandps_avx(auVar78,auVar42);
                auVar75._0_4_ =
                     (float)(uVar89 ^ (uint)(local_14c8._0_4_ * fVar4 +
                                            fVar80 * local_1498._0_4_ + fVar67 * local_14a8._0_4_));
                auVar75._4_4_ =
                     (float)(uVar91 ^ (uint)(local_14c8._4_4_ * fVar7 +
                                            fVar6 * local_1498._4_4_ + fVar5 * local_14a8._4_4_));
                auVar75._8_4_ =
                     (float)(uVar92 ^ (uint)(local_14c8._8_4_ * fVar10 +
                                            fVar9 * local_1498._8_4_ + fVar8 * local_14a8._8_4_));
                auVar75._12_4_ =
                     (float)(uVar93 ^ (uint)(local_14c8._12_4_ * fVar13 +
                                            fVar12 * local_1498._12_4_ + fVar11 * local_14a8._12_4_)
                            );
                fVar56 = (ray->org).field_0.m128[3];
                fVar65 = auVar53._0_4_;
                auVar55._0_4_ = fVar65 * fVar56;
                fVar66 = auVar53._4_4_;
                auVar55._4_4_ = fVar66 * fVar56;
                fVar67 = auVar53._8_4_;
                auVar55._8_4_ = fVar67 * fVar56;
                fVar80 = auVar53._12_4_;
                auVar55._12_4_ = fVar80 * fVar56;
                auVar81 = vcmpps_avx(auVar55,auVar75,1);
                fVar56 = ray->tfar;
                auVar64._0_4_ = fVar65 * fVar56;
                auVar64._4_4_ = fVar66 * fVar56;
                auVar64._8_4_ = fVar67 * fVar56;
                auVar64._12_4_ = fVar80 * fVar56;
                auVar74 = vcmpps_avx(auVar75,auVar64,2);
                auVar81 = vandps_avx(auVar74,auVar81);
                auVar74 = auVar78 & auVar81;
                if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar74[0xf] < '\0') {
                  auVar78 = vandps_avx(auVar78,auVar81);
                  local_1308 = local_14c8;
                  local_12f8 = local_1498._0_8_;
                  uStack_12f0 = local_1498._8_8_;
                  local_12e8 = local_14a8._0_8_;
                  uStack_12e0 = local_14a8._8_8_;
                  uStack_1450 = auVar73._8_8_;
                  local_1458 = local_1410->scene;
                  auVar53 = vrcpps_avx(auVar53);
                  fVar56 = auVar53._0_4_;
                  auVar72._0_4_ = fVar65 * fVar56;
                  fVar65 = auVar53._4_4_;
                  auVar72._4_4_ = fVar66 * fVar65;
                  fVar66 = auVar53._8_4_;
                  auVar72._8_4_ = fVar67 * fVar66;
                  fVar67 = auVar53._12_4_;
                  auVar72._12_4_ = fVar80 * fVar67;
                  auVar76._8_4_ = 0x3f800000;
                  auVar76._0_8_ = &DAT_3f8000003f800000;
                  auVar76._12_4_ = 0x3f800000;
                  auVar53 = vsubps_avx(auVar76,auVar72);
                  fVar56 = fVar56 + fVar56 * auVar53._0_4_;
                  fVar65 = fVar65 + fVar65 * auVar53._4_4_;
                  fVar66 = fVar66 + fVar66 * auVar53._8_4_;
                  fVar67 = fVar67 + fVar67 * auVar53._12_4_;
                  local_1318[0] = fVar56 * auVar75._0_4_;
                  local_1318[1] = fVar65 * auVar75._4_4_;
                  local_1318[2] = fVar66 * auVar75._8_4_;
                  local_1318[3] = fVar67 * auVar75._12_4_;
                  local_1338._0_4_ = fVar56 * auVar85._0_4_;
                  local_1338._4_4_ = fVar65 * auVar85._4_4_;
                  local_1338._8_4_ = fVar66 * auVar85._8_4_;
                  local_1338._12_4_ = fVar67 * auVar85._12_4_;
                  local_1328._0_4_ = fVar56 * auVar87._0_4_;
                  local_1328._4_4_ = fVar65 * auVar87._4_4_;
                  local_1328._8_4_ = fVar66 * auVar87._8_4_;
                  local_1328._12_4_ = fVar67 * auVar87._12_4_;
                  uVar48 = vmovmskps_avx(auVar78);
                  uVar45 = CONCAT44((int)((ulong)local_1410->scene >> 0x20),uVar48);
                  do {
                    local_14c8._0_8_ = uVar45;
                    uVar47 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                      }
                    }
                    local_14a8._0_8_ = uVar47;
                    h.geomID = *(uint *)(lVar50 + uVar46 + 0x90 + uVar47 * 4);
                    local_1488._0_8_ = CONCAT44(0,h.geomID);
                    lVar3 = *(long *)(*(long *)((long)local_1458 + 0x1e8) + CONCAT44(0,h.geomID) * 8
                                     );
                    local_1498._0_8_ = lVar3;
                    if ((*(uint *)(lVar3 + 0x34) & ray->mask) == 0) {
                      local_14c8._0_8_ = uVar45 ^ 1L << (uVar47 & 0x3f);
                      bVar41 = true;
                    }
                    else {
                      local_1468._0_8_ = local_1410->args;
                      if ((local_1410->args->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar3 + 0x48) == 0)) {
                        bVar41 = false;
                      }
                      else {
                        h.u = *(float *)(local_1338 + uVar47 * 4);
                        h.v = *(float *)(local_1328 + uVar47 * 4);
                        args.context = local_1410->user;
                        h.primID = *(uint *)(lVar50 + uVar46 + 0xa0 + uVar47 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar47 * 4);
                        h.Ng.field_0.field_0.y = *(float *)((long)&local_12f8 + uVar47 * 4);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_12e8 + uVar47 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_1488._0_4_ = ray->tfar;
                        ray->tfar = local_1318[uVar47];
                        local_14ac = -1;
                        args.valid = &local_14ac;
                        args.geometryUserPtr = *(void **)(lVar3 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((*(code **)(lVar3 + 0x48) == (code *)0x0) ||
                           ((**(code **)(lVar3 + 0x48))(&args), *args.valid != 0)) {
                          if (*(code **)(local_1468._0_8_ + 0x10) != (code *)0x0) {
                            if (((*(byte *)local_1468._0_8_ & 2) != 0) ||
                               ((*(byte *)(local_1498._0_8_ + 0x3e) & 0x40) != 0)) {
                              (**(code **)(local_1468._0_8_ + 0x10))(&args);
                            }
                            if (*args.valid == 0) goto LAB_00304424;
                          }
                          bVar41 = false;
                        }
                        else {
LAB_00304424:
                          ray->tfar = (float)local_1488._0_4_;
                          local_14c8._0_8_ = uVar45 ^ 1L << (local_14a8._0_8_ & 0x3f);
                          bVar41 = true;
                        }
                      }
                    }
                    if (!bVar41) {
                      auVar84 = ZEXT3264(local_11f8);
                      auVar86 = ZEXT3264(local_1218);
                      auVar88 = ZEXT3264(local_1238);
                      auVar90 = ZEXT3264(local_1258);
                      auVar94 = ZEXT3264(local_1278);
                      auVar77 = ZEXT3264(local_1298);
                      auVar79 = ZEXT3264(local_12b8);
                      auVar83 = ZEXT3264(local_12d8);
                      iVar51 = 0;
                      uVar49 = local_1470;
                      if (bVar52) {
                        ray->tfar = -INFINITY;
                        iVar51 = 3;
                      }
                      goto LAB_003044dd;
                    }
                    uVar45 = local_14c8._0_8_;
                  } while (local_14c8._0_8_ != 0);
                }
              }
              uVar49 = uVar49 + 1;
              bVar52 = uVar49 < local_1440;
            } while (uVar49 != local_1440);
            auVar84 = ZEXT3264(local_11f8);
            auVar86 = ZEXT3264(local_1218);
            auVar88 = ZEXT3264(local_1238);
            auVar90 = ZEXT3264(local_1258);
            auVar94 = ZEXT3264(local_1278);
            auVar77 = ZEXT3264(local_1298);
            auVar79 = ZEXT3264(local_12b8);
            auVar83 = ZEXT3264(local_12d8);
            uVar49 = local_1470;
          }
          iVar51 = 0;
        }
LAB_003044dd:
      } while (iVar51 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }